

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perceptron.hpp
# Opt level: O1

void __thiscall Preceptron_SIGMOID::Backward(Preceptron_SIGMOID *this)

{
  pointer pdVar1;
  pointer pdVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  double extraout_XMM0_Qa;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  
  if ((this->super_Preceptron).weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->super_Preceptron).weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar6 = 0;
    do {
      (*(this->super_Preceptron)._vptr_Preceptron[2])
                ((this->super_Preceptron).input.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar6],this);
      dVar7 = (this->super_Preceptron).input.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar6] * extraout_XMM0_Qa *
              (this->super_Preceptron).error;
      pdVar1 = (this->super_Preceptron).weight.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar9 = pdVar1[uVar6] * dVar7;
      (this->super_Preceptron).delta_weight.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar6] = dVar9;
      pdVar1[uVar6] =
           dVar9 * (this->super_Preceptron).motivation +
           dVar7 * (this->super_Preceptron).learning_step + pdVar1[uVar6];
      (this->super_Preceptron).delta_bias.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar6] =
           extraout_XMM0_Qa * (this->super_Preceptron).error;
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)(this->super_Preceptron).weight.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(this->super_Preceptron).weight.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 3));
  }
  if ((this->super_Preceptron).useBias == true) {
    pdVar1 = (this->super_Preceptron).delta_bias.super__Vector_base<double,_std::allocator<double>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar2 = (this->super_Preceptron).delta_bias.super__Vector_base<double,_std::allocator<double>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar3 = (long)pdVar2 - (long)pdVar1;
    lVar4 = lVar3 >> 3;
    if (pdVar2 == pdVar1) {
      dVar7 = 0.0;
    }
    else {
      dVar7 = 0.0;
      lVar5 = 0;
      do {
        dVar7 = dVar7 + pdVar1[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
    }
    auVar8._8_4_ = (int)(lVar3 >> 0x23);
    auVar8._0_8_ = lVar4;
    auVar8._12_4_ = 0x45300000;
    (this->super_Preceptron).bias =
         (dVar7 / ((auVar8._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0))) *
         (this->super_Preceptron).learning_step + (this->super_Preceptron).bias;
  }
  return;
}

Assistant:

void Backward() {
		for (int i = 0; i < weight.size(); i++) {
			double derivation = Derivation(input[i]);
			double internal_weight_error = input[i] * derivation * error;
			delta_weight[i] = weight[i] * internal_weight_error;
			weight[i] += delta_weight[i] * motivation + learning_step * internal_weight_error;
			delta_bias[i] = derivation * error;
		}
		if (useBias) {
			double average_bias_error = 0.0;
			for (int i = 0; i < delta_bias.size(); i++) {
				average_bias_error += delta_bias[i];
			}average_bias_error /= delta_bias.size();
			bias += learning_step * average_bias_error;
		}
	}